

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Preface::Preface(Preface *this,Dictionary *d)

{
  _Base_ptr p_Var1;
  Dictionary *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  InterchangeObject *pIVar4;
  UUID *pUVar5;
  UL *pUVar6;
  MDDEntry *pMVar7;
  
  (this->super_InterchangeObject).super_KLVPacket.m_KeyStart = (byte_t *)0x0;
  (this->super_InterchangeObject).super_KLVPacket.m_KLLength = 0;
  pIVar4 = &this->super_InterchangeObject;
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_HasValue = false;
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[0] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[1] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[2] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[3] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[4] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[5] = '\0';
  (pIVar4->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar6 = &(this->super_InterchangeObject).super_KLVPacket.m_UL;
  (pUVar6->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_InterchangeObject).super_KLVPacket.m_ValueStart = (byte_t *)0x0;
  (this->super_InterchangeObject).super_KLVPacket.m_ValueLength = 0;
  (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_0021d318;
  (this->super_InterchangeObject).m_Dict = d;
  (this->super_InterchangeObject).m_Lookup = (IPrimerLookup *)0x0;
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_HasValue = false;
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[0] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[1] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[2] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[3] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[4] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[5] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &(this->super_InterchangeObject).InstanceUID;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00222020;
  pIVar4 = &this->super_InterchangeObject;
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_HasValue = false;
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (pIVar4->GenerationUID).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &(this->super_InterchangeObject).GenerationUID.m_property;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value[0xf] = '\0'
  ;
  (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_00222020;
  (this->super_InterchangeObject).GenerationUID.m_has_value = false;
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Preface_00222248;
  Kumu::Timestamp::Timestamp(&this->LastModifiedDate);
  this->Version = 0x102;
  (this->ObjectModelVersion).m_has_value = false;
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &(this->PrimaryPackage).m_property;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00222020;
  (this->PrimaryPackage).m_has_value = false;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00222a50;
  (this->ContentStorage).super_Identifier<16U>.m_HasValue = false;
  (this->ContentStorage).super_Identifier<16U>.m_Value[0] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[1] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[2] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[3] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[4] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[5] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &this->ContentStorage;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->ContentStorage).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00222020;
  (this->OperationalPattern).super_Identifier<16U>.m_HasValue = false;
  (this->OperationalPattern).super_Identifier<16U>.m_Value[0] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[1] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[2] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[3] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[4] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[5] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar6 = &this->OperationalPattern;
  (pUVar6->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar6->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  p_Var1 = &(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>
            .super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var1;
  *(size_t *)
   ((long)&(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00222840;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__Batch_00222880;
  p_Var1 = &(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
            super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var1;
  *(size_t *)
   ((long)&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
           super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00222840;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__Batch_00222880;
  p_Var1 = (_Base_ptr)
           ((long)&(this->ApplicationSchemes).m_property.
                   super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                   super_PushSet<ASDCP::UL>.
                   super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t.
                   _M_impl + 8);
  (((_Rb_tree_header *)
   ((long)&(this->ApplicationSchemes).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl + 8))
  ->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->ApplicationSchemes).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->ApplicationSchemes).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x18) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->ApplicationSchemes).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x20) = p_Var1;
  *(size_t *)
   ((long)&(this->ApplicationSchemes).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x28) = 0;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  _vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00222840;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__Batch_00222880;
  (this->ApplicationSchemes).m_has_value = false;
  p_Var1 = (_Base_ptr)
           ((long)&(this->ConformsToSpecifications).m_property.
                   super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                   super_PushSet<ASDCP::UL>.
                   super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t.
                   _M_impl + 8);
  (((_Rb_tree_header *)
   ((long)&(this->ConformsToSpecifications).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl + 8))
  ->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->ConformsToSpecifications).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->ConformsToSpecifications).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x18) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->ConformsToSpecifications).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x20) = p_Var1;
  *(size_t *)
   ((long)&(this->ConformsToSpecifications).m_property.
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl +
   0x28) = 0;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  _vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00222840;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__Batch_00222880;
  (this->ConformsToSpecifications).m_has_value = false;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar7 = Dictionary::Type(this_00,MDD_Preface);
    uVar2 = *(undefined8 *)pMVar7->ul;
    uVar3 = *(undefined8 *)(pMVar7->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar2;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar3;
    (this->ObjectModelVersion).m_property = 0;
    (this->ObjectModelVersion).m_has_value = true;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x26a,"ASDCP::MXF::Preface::Preface(const Dictionary *)");
}

Assistant:

ASDCP::MXF::Preface::Preface(const Dictionary* d) :
  InterchangeObject(d), Version(258)
{
  assert(m_Dict);
  m_UL = m_Dict->Type(MDD_Preface).ul;
  ObjectModelVersion = 0;
}